

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opl_mus_player.cpp
# Opt level: O1

int __thiscall OPLmusicFile::PlayTick(OPLmusicFile *this)

{
  musicBlock *pmVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  ushort uVar5;
  BYTE *pBVar6;
  OPLio *pOVar7;
  bool bVar8;
  byte bVar9;
  uint uVar10;
  byte *pbVar11;
  byte bVar12;
  int unaff_EBP;
  long lVar13;
  byte *pbVar14;
  
  switch(this->RawPlayer) {
  case RDosPlay:
    do {
      while( true ) {
        pbVar11 = (this->super_OPLmusicBlock).super_musicBlock.score;
        if ((this->super_OPLmusicBlock).super_musicBlock.scoredata + this->ScoreLen <= pbVar11) {
          return 0;
        }
        (this->super_OPLmusicBlock).super_musicBlock.score = pbVar11 + 1;
        bVar12 = *pbVar11;
        (this->super_OPLmusicBlock).super_musicBlock.score = pbVar11 + 2;
        bVar2 = pbVar11[1];
        if (bVar2 == 0xff) break;
        if (bVar2 == 2) {
          if (bVar12 == 2) {
            this->WhichChip = 1;
          }
          else if (bVar12 == 1) {
            this->WhichChip = 0;
          }
          else if (bVar12 == 0) {
            (this->super_OPLmusicBlock).SamplesPerTick =
                 (double)*(ushort *)(pbVar11 + 2) * 0.041666666666666664;
            (*((this->super_OPLmusicBlock).super_musicBlock.io)->_vptr_OPLio[5])();
            pmVar1 = &(this->super_OPLmusicBlock).super_musicBlock;
            pmVar1->score = pmVar1->score + 2;
          }
        }
        else if (bVar2 == 0) {
          if (bVar12 != 0) {
            return (uint)bVar12;
          }
        }
        else {
          pOVar7 = (this->super_OPLmusicBlock).super_musicBlock.io;
          (*pOVar7->_vptr_OPLio[4])(pOVar7,(ulong)(uint)this->WhichChip,(ulong)bVar2,(ulong)bVar12);
        }
      }
    } while (bVar12 != 0xff);
    break;
  case IMF:
    pbVar14 = (this->super_OPLmusicBlock).super_musicBlock.score;
    pbVar11 = pbVar14 + 4;
    if ((long)pbVar11 - (long)(this->super_OPLmusicBlock).super_musicBlock.scoredata <=
        (long)this->ScoreLen) {
      do {
        if (*(int *)pbVar14 == -1) {
          return 0;
        }
        bVar12 = *pbVar14;
        bVar2 = pbVar14[1];
        uVar5 = *(ushort *)(pbVar14 + 2);
        (this->super_OPLmusicBlock).super_musicBlock.score = pbVar11;
        pOVar7 = (this->super_OPLmusicBlock).super_musicBlock.io;
        (*pOVar7->_vptr_OPLio[4])(pOVar7,0,(ulong)bVar12,(ulong)bVar2);
        if (uVar5 != 0) break;
        pbVar14 = (this->super_OPLmusicBlock).super_musicBlock.score;
        pbVar11 = pbVar14 + 4;
      } while ((long)pbVar11 - (long)(this->super_OPLmusicBlock).super_musicBlock.scoredata <=
               (long)this->ScoreLen);
      return (uint)uVar5;
    }
    break;
  case DosBox1:
    pbVar11 = (this->super_OPLmusicBlock).super_musicBlock.score;
    if (pbVar11 < (this->super_OPLmusicBlock).super_musicBlock.scoredata + this->ScoreLen) {
      do {
        pbVar14 = pbVar11 + 1;
        (this->super_OPLmusicBlock).super_musicBlock.score = pbVar14;
        bVar12 = *pbVar11;
        switch(bVar12) {
        case 0:
          (this->super_OPLmusicBlock).super_musicBlock.score = pbVar11 + 2;
          return pbVar11[1] + 1;
        case 1:
          uVar5 = *(ushort *)(pbVar11 + 1);
          (this->super_OPLmusicBlock).super_musicBlock.score = pbVar11 + 3;
          return uVar5 + 1;
        case 2:
          this->WhichChip = 0;
          break;
        case 3:
          this->WhichChip = 1;
          break;
        case 4:
          pbVar14 = pbVar11 + 2;
          (this->super_OPLmusicBlock).super_musicBlock.score = pbVar14;
          bVar12 = pbVar11[1];
          lVar13 = 3;
          goto LAB_003342aa;
        default:
          lVar13 = 2;
LAB_003342aa:
          (this->super_OPLmusicBlock).super_musicBlock.score = pbVar11 + lVar13;
          pOVar7 = (this->super_OPLmusicBlock).super_musicBlock.io;
          (*pOVar7->_vptr_OPLio[4])
                    (pOVar7,(ulong)(uint)this->WhichChip,(ulong)bVar12,(ulong)*pbVar14);
        }
        pbVar11 = (this->super_OPLmusicBlock).super_musicBlock.score;
      } while (pbVar11 < (this->super_OPLmusicBlock).super_musicBlock.scoredata + this->ScoreLen);
    }
    break;
  case DosBox2:
    pBVar6 = (this->super_OPLmusicBlock).super_musicBlock.scoredata;
    bVar12 = pBVar6[0x19];
    bVar2 = pBVar6[0x17];
    bVar3 = pBVar6[0x18];
    do {
      pbVar11 = (this->super_OPLmusicBlock).super_musicBlock.score;
      pbVar14 = (this->super_OPLmusicBlock).super_musicBlock.scoredata + this->ScoreLen;
      if (pbVar14 <= pbVar11) break;
      (this->super_OPLmusicBlock).super_musicBlock.score = pbVar11 + 1;
      bVar4 = *pbVar11;
      (this->super_OPLmusicBlock).super_musicBlock.score = pbVar11 + 2;
      uVar10 = bVar4 & 0x7f;
      bVar9 = (byte)uVar10;
      if (bVar9 == bVar2) {
        unaff_EBP = pbVar11[1] + 1;
LAB_0033434d:
        bVar8 = false;
      }
      else {
        if (bVar9 == bVar3) {
          unaff_EBP = (uint)pbVar11[1] * 0x100 + 0x100;
          goto LAB_0033434d;
        }
        bVar8 = true;
        if (bVar9 < bVar12) {
          pOVar7 = (this->super_OPLmusicBlock).super_musicBlock.io;
          (*pOVar7->_vptr_OPLio[4])(pOVar7,(ulong)(bVar4 >> 7),(ulong)pBVar6[(ulong)uVar10 + 0x1a]);
        }
      }
    } while (bVar8);
    if (pbVar11 < pbVar14) {
      return unaff_EBP;
    }
  }
  return 0;
}

Assistant:

int OPLmusicFile::PlayTick ()
{
	BYTE reg, data;
	WORD delay;

	switch (RawPlayer)
	{
	case RDosPlay:
		while (score < scoredata + ScoreLen)
		{
			data = *score++;
			reg = *score++;
			switch (reg)
			{
			case 0:		// Delay
				if (data != 0)
				{
					return data;
				}
				break;

			case 2:		// Speed change or OPL3 switch
				if (data == 0)
				{
					SamplesPerTick = LittleShort(*(WORD *)(score)) / ADLIB_CLOCK_MUL;
					io->SetClockRate(SamplesPerTick);
					score += 2;
				}
				else if (data == 1)
				{
					WhichChip = 0;
				}
				else if (data == 2)
				{
					WhichChip = 1;
				}
				break;

			case 0xFF:	// End of song
				if (data == 0xFF)
				{
					return 0;
				}
				break;

			default:	// It's something to stuff into the OPL chip
				io->OPLwriteReg(WhichChip, reg, data);
				break;
			}
		}
		break;

	case DosBox1:
		while (score < scoredata + ScoreLen)
		{
			reg = *score++;

			if (reg == 4)
			{
				reg = *score++;
				data = *score++;
			}
			else if (reg == 0)
			{ // One-byte delay
				return *score++ + 1;
			}
			else if (reg == 1)
			{ // Two-byte delay
				int delay = score[0] + (score[1] << 8) + 1;
				score += 2;
				return delay;
			}
			else if (reg == 2)
			{ // Select OPL chip 0
				WhichChip = 0;
				continue;
			}
			else if (reg == 3)
			{ // Select OPL chip 1
				WhichChip = 1;
				continue;
			}
			else
			{
				data = *score++;
			}
			io->OPLwriteReg(WhichChip, reg, data);
		}
		break;

	case DosBox2:
		{
			BYTE *to_reg = scoredata + 0x1A;
			BYTE to_reg_size = scoredata[0x19];
			BYTE short_delay_code = scoredata[0x17];
			BYTE long_delay_code = scoredata[0x18];

			while (score < scoredata + ScoreLen)
			{
				BYTE code = *score++;
				data = *score++;

				// Which OPL chip to write to is encoded in the high bit of the code value.
				int which = !!(code & 0x80);
				code &= 0x7F;

				if (code == short_delay_code)
				{
					return data + 1;
				}
				else if (code == long_delay_code)
				{
					return (data + 1) << 8;
				}
				else if (code < to_reg_size)
				{
					io->OPLwriteReg(which, to_reg[code], data);
				}
			}
		}
		break;

	case IMF:
		delay = 0;
		while (delay == 0 && score + 4 - scoredata <= ScoreLen)
		{
			if (*(DWORD *)score == 0xFFFFFFFF)
			{ // This is a special value that means to end the song.
				return 0;
			}
			reg = score[0];
			data = score[1];
			delay = LittleShort(((WORD *)score)[1]);
			score += 4;
			io->OPLwriteReg (0, reg, data);
		}
		return delay;
	}
	return 0;
}